

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

void __thiscall Fluid_Table::DrawData(Fluid_Table *this,char *s,int X,int Y,int W,int H)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0xff);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,W,H);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x20);
  fl_draw(s,X,Y,W,H,0,(Fl_Image *)0x0,1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)(this->super_Fl_Table).super_Fl_Group.super_Fl_Widget.color_)
  ;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,W,H);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void DrawData(const char *s, int X, int Y, int W, int H) {
    fl_push_clip(X,Y,W,H);
    // Draw cell bg
    fl_color(FL_WHITE); fl_rectf(X,Y,W,H);
    // Draw cell data
    fl_color(FL_GRAY0); fl_draw(s, X,Y,W,H, FL_ALIGN_CENTER);
    // Draw box border
    fl_color(color()); fl_rect(X,Y,W,H);
    fl_pop_clip();
  }